

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

Slice __thiscall leveldb::anon_unknown_3::DBIter::value(DBIter *this)

{
  long lVar1;
  Slice *in_RDI;
  long in_FS_OFFSET;
  Slice SVar2;
  string *in_stack_ffffffffffffffd0;
  char *local_18;
  size_t local_10;
  
  SVar2.size_ = local_10;
  SVar2.data_ = local_18;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((ulong)in_RDI[9].data_ & 0x100000000) == 0) {
    __assert_fail("valid_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_iter.cc"
                  ,0x45,"virtual Slice leveldb::(anonymous namespace)::DBIter::value() const");
  }
  if (*(int *)&in_RDI[9].data_ == 0) {
    SVar2 = (Slice)(**(code **)(*(long *)in_RDI[3].size_ + 0x48))();
  }
  else {
    Slice::Slice(in_RDI,in_stack_ffffffffffffffd0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SVar2;
  }
  __stack_chk_fail();
}

Assistant:

Slice value() const override {
    assert(valid_);
    return (direction_ == kForward) ? iter_->value() : saved_value_;
  }